

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::InitializeEmpty(RowGroup *this,vector<duckdb::LogicalType,_true> *types)

{
  BlockManager *block_manager;
  idx_t start_row;
  DataTableInfo *info;
  const_reference type;
  ulong __n;
  shared_ptr<duckdb::ColumnData,_true> column_data;
  
  for (__n = 0; __n < (ulong)(((long)(types->
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ).
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(types->
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ).
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    block_manager = ((this->collection)._M_data)->block_manager;
    info = GetTableInfo(this);
    start_row = (this->super_SegmentBase<duckdb::RowGroup>).start;
    type = vector<duckdb::LogicalType,_true>::get<true>(types,__n);
    ColumnData::CreateColumn
              ((ColumnData *)&column_data,block_manager,info,__n,start_row,type,
               (optional_ptr<duckdb::ColumnData,_true>)0x0);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
              ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
                *)&this->columns,&column_data);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&column_data.internal.
                super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void RowGroup::InitializeEmpty(const vector<LogicalType> &types) {
	// set up the segment trees for the column segments
	D_ASSERT(columns.empty());
	for (idx_t i = 0; i < types.size(); i++) {
		auto column_data = ColumnData::CreateColumn(GetBlockManager(), GetTableInfo(), i, start, types[i]);
		columns.push_back(std::move(column_data));
	}
}